

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp.c
# Opt level: O3

err_t botpTOTPRand(char *otp,size_t digit,octet *key,size_t key_len,tm_time_t t)

{
  bool_t bVar1;
  size_t sVar2;
  size_t *state;
  err_t eVar3;
  
  eVar3 = 0x1f6;
  if (0xfffffffffffffffc < digit - 9) {
    if (t == -1) {
      eVar3 = 0x133;
    }
    else {
      bVar1 = memIsValid(otp,digit + 1);
      eVar3 = 0x6d;
      if (bVar1 != 0) {
        bVar1 = memIsValid(key,key_len);
        if (bVar1 != 0) {
          eVar3 = 0;
          sVar2 = beltHMAC_keep();
          state = (size_t *)blobCreate(sVar2 * 2 + 0x40);
          if (state == (size_t *)0x0) {
            eVar3 = 0x6e;
          }
          else {
            *state = digit;
            sVar2 = beltHMAC_keep();
            beltHMACStart((void *)((long)state + sVar2 + 0x3a),key,key_len);
            botpTOTPStepR(otp,t,state);
            blobClose(state);
          }
        }
      }
    }
  }
  return eVar3;
}

Assistant:

err_t botpTOTPRand(char* otp, size_t digit, const octet key[], size_t key_len, 
	tm_time_t t)
{
	void* state;
	// проверить входные данные
	if (digit < 6 || digit > 8)
		return ERR_BAD_PARAMS;
	if (t == TIME_ERR)
		return ERR_BAD_TIME;
	if (!memIsValid(otp, digit + 1) || 
		!memIsValid(key, key_len))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(botpTOTP_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// сгенерировать пароль
	botpTOTPStart(state, digit, key, key_len);
	botpTOTPStepR(otp, t, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}